

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cc
# Opt level: O0

bool google::protobuf::internal::EpsCopyInputStream::ParseEndsInSlopRegion<false>
               (char *begin,int overrun,int depth)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  LogMessage *pLVar5;
  char *end;
  char *ptr;
  Voidify local_49;
  Nullable<const_char_*> local_48;
  Nullable<const_char_*> absl_log_internal_check_op_result_1;
  Voidify local_29;
  Nullable<const_char_*> local_28;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  int local_18;
  int kSlopBytes;
  int depth_local;
  int overrun_local;
  char *begin_local;
  
  absl_log_internal_check_op_result._4_4_ = 0x10;
  local_18 = depth;
  kSlopBytes = overrun;
  _depth_local = begin;
  iVar2 = absl::lts_20250127::log_internal::GetReferenceableValue(overrun);
  iVar3 = absl::lts_20250127::log_internal::GetReferenceableValue(0);
  local_28 = absl::lts_20250127::log_internal::Check_GEImpl(iVar2,iVar3,"overrun >= 0");
  if (local_28 != (Nullable<const_char_*>)0x0) {
    pcVar4 = absl::lts_20250127::implicit_cast<char_const*>(local_28);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&absl_log_internal_check_op_result_1,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/parse_context.cc"
               ,0x59,pcVar4);
    pLVar5 = absl::lts_20250127::log_internal::LogMessage::InternalStream
                       ((LogMessage *)&absl_log_internal_check_op_result_1);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_29,pLVar5);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&absl_log_internal_check_op_result_1);
  }
  iVar2 = absl::lts_20250127::log_internal::GetReferenceableValue(kSlopBytes);
  iVar3 = absl::lts_20250127::log_internal::GetReferenceableValue(0x10);
  local_48 = absl::lts_20250127::log_internal::Check_LEImpl(iVar2,iVar3,"overrun <= kSlopBytes");
  if (local_48 != (Nullable<const_char_*>)0x0) {
    pcVar4 = absl::lts_20250127::implicit_cast<char_const*>(local_48);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&ptr,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/parse_context.cc"
               ,0x5a,pcVar4);
    pLVar5 = absl::lts_20250127::log_internal::LogMessage::InternalStream((LogMessage *)&ptr);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_49,pLVar5);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&ptr);
  }
  bVar1 = anon_unknown_0::ParsingEndsInBuffer
                    (_depth_local + kSlopBytes,_depth_local + 0x10,local_18);
  return bVar1;
}

Assistant:

bool EpsCopyInputStream::ParseEndsInSlopRegion(const char* begin, int overrun,
                                               int depth) {
  constexpr int kSlopBytes = EpsCopyInputStream::kSlopBytes;
  ABSL_DCHECK_GE(overrun, 0);
  ABSL_DCHECK_LE(overrun, kSlopBytes);
  auto ptr = begin + overrun;
  auto end = begin + kSlopBytes;
  return ParsingEndsInBuffer(ptr, end, depth);
}